

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O3

bool __thiscall TypeInfo::testUnions(TypeInfo *this)

{
  wchar16 wVar1;
  short sVar2;
  short sVar3;
  wchar16 wVar4;
  XMLCh XVar5;
  XMLCh XVar6;
  DOMElement *pDVar7;
  long *plVar8;
  long *plVar9;
  wchar16 *pwVar10;
  ostream *poVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  short *psVar15;
  long *plVar16;
  wchar16 *pwVar17;
  XMLCh *pXVar18;
  XMLCh *pXVar19;
  short *psVar20;
  undefined1 uVar21;
  XStr local_40;
  XStr local_38;
  
  (**(code **)(*(long *)this->doc + 0x68))();
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unionTest",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar7 = findElement(this,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x38))(pDVar7);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
  pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_001172b9:
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_0011733a;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_0011733a:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar10;
          if (wVar1 == L'\0') goto LAB_0011733a;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001172b9;
LAB_001172a7:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001172a7;
      }
      if (wVar1 == L'\0') goto LAB_001172b9;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_001172a7;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  uVar21 = tmp;
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_38.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar14 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_0011750c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_0011750c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar14 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_001175b3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_001175b3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
  pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_001176b0:
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00117733;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00117733:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar10;
          if (wVar1 == L'\0') goto LAB_00117733;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001176b0;
LAB_0011769e:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_0011769e;
      }
      if (wVar1 == L'\0') goto LAB_001176b0;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_0011769e;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,500);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_38.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar14 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00117902:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00117902;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar14 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_001179a8:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_001179a8;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
  pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_00117a9a:
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    psVar15 = (short *)(**(code **)(*plVar9 + 0x18))(plVar9);
    if (psVar15 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar15 != (short *)0x0) {
        do {
          sVar2 = *psVar15;
          if (sVar2 == 0) goto LAB_00117ae0;
          psVar15 = psVar15 + 1;
          sVar3 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar2 == sVar3);
        goto LAB_00117adc;
      }
LAB_00117ae0:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00117a9a;
LAB_00117a94:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00117a94;
      }
      if (wVar1 == L'\0') goto LAB_00117a9a;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_00117a94;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
LAB_00117adc:
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar14 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00117c8e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00117c8e;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar14 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00117d34:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00117d34;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
  pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_00117e26:
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    psVar15 = (short *)(**(code **)(*plVar9 + 0x18))(plVar9);
    if (psVar15 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar15 != (short *)0x0) {
        do {
          sVar2 = *psVar15;
          if (sVar2 == 0) goto LAB_00117e6c;
          psVar15 = psVar15 + 1;
          sVar3 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar2 == sVar3);
        goto LAB_00117e68;
      }
LAB_00117e6c:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00117e26;
LAB_00117e20:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00117e20;
      }
      if (wVar1 == L'\0') goto LAB_00117e26;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_00117e20;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
LAB_00117e68:
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1fa);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar14 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_0011801a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_0011801a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar14 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_001180c0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_001180c0;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_001181f5:
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x18))(plVar16);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_0011827a;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_0011827a:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar10;
          if (wVar1 == L'\0') goto LAB_0011827a;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001181f5;
LAB_001181e3:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001181e3;
      }
      if (wVar1 == L'\0') goto LAB_001181f5;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_001181e3;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1fe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_38.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x10))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00118449:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00118449;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x18))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_001184ef:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_001184ef;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr2",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_0011860f:
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x18))(plVar16);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00118694;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00118694:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar10;
          if (wVar1 == L'\0') goto LAB_00118694;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_0011860f;
LAB_001185fd:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001185fd;
      }
      if (wVar1 == L'\0') goto LAB_0011860f;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_001185fd;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x200);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_38.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x10))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00118863:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00118863;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x18))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00118909:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00118909;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_00118a3e:
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x18))(plVar16);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00118ac3;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00118ac3:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar10;
          if (wVar1 == L'\0') goto LAB_00118ac3;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00118a3e;
LAB_00118a2c:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00118a2c;
      }
      if (wVar1 == L'\0') goto LAB_00118a3e;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_00118a2c;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x204);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_38.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x10))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00118c92:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00118c92;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x18))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00118d38:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00118d38;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr2",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_00118e58:
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x18))(plVar16);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_38.fUnicodeForm) {
      pwVar17 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_38.fUnicodeForm != (wchar16 *)0x0) goto LAB_00118edd;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_38.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00118edd:
            tmp = *pwVar17 == L'\0';
          }
        }
      }
      else {
        do {
          wVar1 = *pwVar10;
          if (wVar1 == L'\0') goto LAB_00118edd;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar17;
          pwVar17 = pwVar17 + 1;
        } while (wVar1 == wVar4);
        tmp = false;
      }
    }
    XStr::~XStr(&local_38);
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00118e58;
LAB_00118e46:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00118e46;
      }
      if (wVar1 == L'\0') goto LAB_00118e58;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_00118e46;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x206);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_38.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_38);
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x10))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_001190ac:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_001190ac;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x18))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00119152:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00119152;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_0011927b:
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    psVar15 = (short *)(**(code **)(*plVar16 + 0x18))(plVar16);
    if (psVar15 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar15 != (short *)0x0) {
        do {
          sVar2 = *psVar15;
          if (sVar2 == 0) goto LAB_001192c1;
          psVar15 = psVar15 + 1;
          sVar3 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar2 == sVar3);
        goto LAB_001192bd;
      }
LAB_001192c1:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_0011927b;
LAB_00119275:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00119275;
      }
      if (wVar1 == L'\0') goto LAB_0011927b;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_00119275;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
LAB_001192bd:
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x20a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x10))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_0011946f:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_0011946f;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x18))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00119515:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00119515;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr2",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_00119629:
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    psVar15 = (short *)(**(code **)(*plVar16 + 0x18))(plVar16);
    if (psVar15 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar15 != (short *)0x0) {
        do {
          sVar2 = *psVar15;
          if (sVar2 == 0) goto LAB_0011966f;
          psVar15 = psVar15 + 1;
          sVar3 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar2 == sVar3);
        goto LAB_0011966b;
      }
LAB_0011966f:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_00119629;
LAB_00119623:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_00119623;
      }
      if (wVar1 == L'\0') goto LAB_00119629;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_00119623;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
LAB_0011966b:
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x20c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x10))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_0011981d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_0011981d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x18))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_001198c3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_001198c3;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_40.fUnicodeForm) {
LAB_001199ec:
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    psVar15 = (short *)(**(code **)(*plVar16 + 0x18))(plVar16);
    if (psVar15 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar15 != (short *)0x0) {
        do {
          sVar2 = *psVar15;
          if (sVar2 == 0) goto LAB_00119a32;
          psVar15 = psVar15 + 1;
          sVar3 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar2 == sVar3);
        goto LAB_00119a2e;
      }
LAB_00119a32:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar17 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_40.fUnicodeForm == (wchar16 *)0x0) goto LAB_001199ec;
LAB_001199e6:
        wVar1 = *pwVar17;
      }
      else {
        wVar1 = *pwVar10;
        if ((local_40.fUnicodeForm != (wchar16 *)0x0) && (wVar1 == L'\0')) goto LAB_001199e6;
      }
      if (wVar1 == L'\0') goto LAB_001199ec;
    }
    else {
      do {
        wVar1 = *pwVar10;
        if (wVar1 == L'\0') goto LAB_001199e6;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar17;
        pwVar17 = pwVar17 + 1;
      } while (wVar1 == wVar4);
    }
LAB_00119a2e:
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x210);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\nExpected values : typename \'",0x1d);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
    }
    else {
      sVar13 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
    }
    XStr::~XStr(&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x10))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00119be0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar16 + 0x10))(plVar16);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00119be0;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar16 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar14 = (**(code **)(*plVar16 + 0x18))(plVar16);
    if (lVar14 == 0) {
      pcVar12 = "(null)";
      sVar13 = 6;
LAB_00119c86:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar12 != (char *)0x0) {
        sVar13 = strlen(pcVar12);
        goto LAB_00119c86;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr2",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_40.fUnicodeForm);
  XStr::~XStr(&local_40);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  pXVar18 = (XMLCh *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pXVar18 == local_40.fUnicodeForm) {
LAB_00119d98:
    plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar15 = (short *)(**(code **)(*plVar9 + 0x18))(plVar9);
    if (psVar15 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar15 != (short *)0x0) {
        do {
          sVar2 = *psVar15;
          if (sVar2 == 0) goto LAB_00119dde;
          psVar15 = psVar15 + 1;
          sVar3 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar2 == sVar3);
        goto LAB_00119dda;
      }
LAB_00119dde:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pXVar19 = local_40.fUnicodeForm;
    if (local_40.fUnicodeForm == (XMLCh *)0x0 || pXVar18 == (XMLCh *)0x0) {
      if (pXVar18 == (XMLCh *)0x0) {
        if (local_40.fUnicodeForm == (XMLCh *)0x0) goto LAB_00119d98;
LAB_00119d92:
        XVar5 = *pXVar19;
      }
      else {
        XVar5 = *pXVar18;
        if ((local_40.fUnicodeForm != (XMLCh *)0x0) && (XVar5 == L'\0')) goto LAB_00119d92;
      }
      if (XVar5 == L'\0') goto LAB_00119d98;
    }
    else {
      do {
        XVar5 = *pXVar18;
        if (XVar5 == L'\0') goto LAB_00119d92;
        pXVar18 = pXVar18 + 1;
        XVar6 = *pXVar19;
        pXVar19 = pXVar19 + 1;
      } while (XVar5 == XVar6);
    }
LAB_00119dda:
    tmp = false;
  }
  XStr::~XStr(&local_40);
  if (tmp != false) {
    return (bool)uVar21;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x212);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\nExpected values : typename \'",0x1d)
  ;
  local_40.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                              (local_40.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', uri \'",8);
  pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                              ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                               xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pcVar12 == (char *)0x0) {
    std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
  }
  else {
    sVar13 = strlen(pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,sVar13);
  }
  XStr::~XStr(&local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  lVar14 = (**(code **)(*plVar9 + 0x10))(plVar9);
  if (lVar14 == 0) {
    pcVar12 = "(null)";
    sVar13 = 6;
LAB_00119f8c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
  }
  else {
    plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 != (char *)0x0) {
      sVar13 = strlen(pcVar12);
      goto LAB_00119f8c;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  lVar14 = (**(code **)(*plVar9 + 0x18))(plVar9);
  if (lVar14 == 0) {
    pcVar12 = "(null)";
    sVar13 = 6;
  }
  else {
    plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    pwVar10 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
    pcVar12 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      goto LAB_0011a050;
    }
    sVar13 = strlen(pcVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar13);
LAB_0011a050:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool TypeInfo::testUnions() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning
    DOMAttr *testAttr;

    //element unionTest
    DOMElement *testEle = findElement(X("unionTest"));

    testEle = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    return passed;

}